

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O2

void sys_exithandler(int n)

{
  if (sys_exithandler_trouble != '\0') {
    _exit(1);
  }
  sys_exithandler_trouble = 1;
  fprintf(_stderr,"Pd: signal %d\n",n);
  sys_bail(1);
}

Assistant:

static void sys_exithandler(int n)
{
    static int trouble = 0;
    if (!trouble)
    {
        trouble = 1;
        fprintf(stderr, "Pd: signal %d\n", n);
        sys_bail(1);
    }
    else _exit(1);
}